

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

int32_t u_unescape_63(char *src,UChar *dest,int32_t destCapacity)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  size_t sVar4;
  int32_t length;
  int iVar5;
  int iVar6;
  char *__s;
  int iVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  int32_t lenParsed;
  undefined8 local_38;
  
  pcVar10 = src;
  iVar5 = 0;
  local_38 = in_RAX;
  do {
    lVar8 = 0;
    while( true ) {
      iVar7 = (int)lVar8;
      iVar9 = (int)pcVar10;
      iVar6 = (int)src;
      if (pcVar10[lVar8] == '\0') {
        if (pcVar10 + lVar8 != src) {
          if (dest != (UChar *)0x0) {
            length = 0;
            if (0 < destCapacity - iVar5) {
              length = destCapacity - iVar5;
            }
            iVar3 = iVar7 + (iVar9 - iVar6);
            if (iVar3 <= length) {
              length = iVar3;
            }
            u_charsToUChars_63(src,dest + iVar5,length);
          }
          iVar5 = iVar7 + ((iVar5 + iVar9) - iVar6);
        }
        if (dest == (UChar *)0x0) {
          return iVar5;
        }
        if (destCapacity <= iVar5) {
          return iVar5;
        }
        dest = dest + iVar5;
        goto LAB_001b7ca6;
      }
      if (pcVar10[lVar8] == '\\') break;
      lVar8 = lVar8 + 1;
    }
    local_38 = (ulong)(uint)destCapacity;
    if (pcVar10 + lVar8 != src) {
      if (dest != (UChar *)0x0) {
        iVar3 = destCapacity - iVar5;
        if (destCapacity - iVar5 < 1) {
          iVar3 = 0;
        }
        iVar1 = (iVar9 - iVar6) + iVar7;
        if (iVar1 <= iVar3) {
          iVar3 = iVar1;
        }
        u_charsToUChars_63(src,dest + iVar5,iVar3);
      }
      iVar5 = ((iVar5 + iVar9) - iVar6) + iVar7;
    }
    __s = pcVar10 + lVar8 + 1;
    sVar4 = strlen(__s);
    uVar2 = u_unescapeAt_63(_charPtr_charAt,(int32_t *)((long)&local_38 + 4),(int32_t)sVar4,__s);
    iVar6 = iVar5;
    if ((long)local_38._4_4_ != 0) {
      __s = pcVar10 + lVar8 + local_38._4_4_ + 1;
      src = __s;
      if ((dest == (UChar *)0x0) ||
         ((int)((uint)local_38 - iVar5) < (int)(2 - (uint)(uVar2 < 0x10000)))) {
        iVar6 = (iVar5 - (uint)(uVar2 < 0x10000)) + 2;
      }
      else if (uVar2 < 0x10000) {
        iVar6 = iVar5 + 1;
        dest[iVar5] = (UChar)uVar2;
      }
      else {
        dest[iVar5] = (short)(uVar2 >> 10) + L'ퟀ';
        iVar6 = iVar5 + 2;
        dest[(long)iVar5 + 1] = (UChar)uVar2 & 0x3ffU | 0xdc00;
      }
    }
    pcVar10 = __s;
    destCapacity = (uint)local_38;
    iVar5 = iVar6;
  } while (local_38._4_4_ != 0);
  iVar5 = 0;
  if (0 < (int)(uint)local_38 && dest != (UChar *)0x0) {
LAB_001b7ca6:
    *dest = L'\0';
  }
  return iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_unescape(const char *src, UChar *dest, int32_t destCapacity) {
    const char *segment = src;
    int32_t i = 0;
    char c;

    while ((c=*src) != 0) {
        /* '\\' intentionally written as compiler-specific
         * character constant to correspond to compiler-specific
         * char* constants. */
        if (c == '\\') {
            int32_t lenParsed = 0;
            UChar32 c32;
            if (src != segment) {
                if (dest != NULL) {
                    _appendUChars(dest + i, destCapacity - i,
                                  segment, (int32_t)(src - segment));
                }
                i += (int32_t)(src - segment);
            }
            ++src; /* advance past '\\' */
            c32 = (UChar32)u_unescapeAt(_charPtr_charAt, &lenParsed, (int32_t)uprv_strlen(src), (void*)src);
            if (lenParsed == 0) {
                goto err;
            }
            src += lenParsed; /* advance past escape seq. */
            if (dest != NULL && U16_LENGTH(c32) <= (destCapacity - i)) {
                U16_APPEND_UNSAFE(dest, i, c32);
            } else {
                i += U16_LENGTH(c32);
            }
            segment = src;
        } else {
            ++src;
        }
    }
    if (src != segment) {
        if (dest != NULL) {
            _appendUChars(dest + i, destCapacity - i,
                          segment, (int32_t)(src - segment));
        }
        i += (int32_t)(src - segment);
    }
    if (dest != NULL && i < destCapacity) {
        dest[i] = 0;
    }
    return i;

 err:
    if (dest != NULL && destCapacity > 0) {
        *dest = 0;
    }
    return 0;
}